

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float,duckdb::MedianAbsoluteDeviationOperation<float>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  float fVar1;
  FunctionData *pFVar2;
  iterator iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  AggregateUnaryInput input_data;
  float local_9c;
  ulong local_98;
  long local_90;
  ulong local_88;
  Vector *local_80;
  AggregateUnaryInput local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    lVar8 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      local_88 = count + 0x3f >> 6;
      uVar5 = 0;
      uVar9 = 0;
      local_90 = lVar8;
      local_80 = input;
      do {
        if (*(long *)(input + 0x28) == 0) {
          uVar4 = 0xffffffffffffffff;
        }
        else {
          uVar4 = *(ulong *)(*(long *)(input + 0x28) + uVar5 * 8);
        }
        uVar6 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar6 = count;
        }
        uVar7 = uVar6;
        if (uVar4 != 0) {
          uVar7 = uVar9;
          local_98 = uVar5;
          if (uVar4 == 0xffffffffffffffff) {
            if (uVar9 < uVar6) {
              do {
                fVar1 = *(float *)(lVar8 + uVar9 * 4);
                local_78.input = (AggregateInputData *)CONCAT44(local_78.input._4_4_,fVar1);
                iVar3._M_current = *(float **)(state + 8);
                if (iVar3._M_current == *(float **)(state + 0x10)) {
                  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                            ((vector<float,_std::allocator<float>_> *)state,iVar3,(float *)&local_78
                            );
                }
                else {
                  *iVar3._M_current = fVar1;
                  *(float **)(state + 8) = iVar3._M_current + 1;
                }
                uVar9 = uVar9 + 1;
                uVar7 = uVar9;
              } while (uVar6 != uVar9);
            }
          }
          else {
            lVar8 = local_90;
            if (uVar9 < uVar6) {
              lVar8 = local_90 + uVar9 * 4;
              uVar7 = 0;
              do {
                if ((uVar4 >> (uVar7 & 0x3f) & 1) != 0) {
                  fVar1 = *(float *)(lVar8 + uVar7 * 4);
                  local_78.input = (AggregateInputData *)CONCAT44(local_78.input._4_4_,fVar1);
                  iVar3._M_current = *(float **)(state + 8);
                  if (iVar3._M_current == *(float **)(state + 0x10)) {
                    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                              ((vector<float,_std::allocator<float>_> *)state,iVar3,
                               (float *)&local_78);
                  }
                  else {
                    *iVar3._M_current = fVar1;
                    *(float **)(state + 8) = iVar3._M_current + 1;
                  }
                }
                uVar7 = uVar7 + 1;
              } while ((uVar9 - uVar6) + uVar7 != 0);
              uVar5 = local_98;
              input = local_80;
              lVar8 = local_90;
              uVar7 = uVar9 + uVar7;
            }
          }
        }
        uVar5 = uVar5 + 1;
        uVar9 = uVar7;
      } while (uVar5 != local_88);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      local_78.input_mask = (ValidityMask *)(input + 0x28);
      local_78.input_idx = 0;
      local_78.input = aggr_input_data;
      QuantileOperation::
      ConstantOperation<float,duckdb::QuantileState<float,duckdb::QuantileStandardType>,duckdb::MedianAbsoluteDeviationOperation<float>>
                ((QuantileState<float,_duckdb::QuantileStandardType> *)state,
                 *(float **)(input + 0x20),&local_78,count);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_78.input_idx == 0) {
      if (count != 0) {
        pFVar2 = ((local_78.input)->bind_data).ptr;
        uVar5 = 0;
        do {
          uVar9 = uVar5;
          if (pFVar2 != (FunctionData *)0x0) {
            uVar9 = (ulong)*(uint *)(pFVar2 + uVar5 * 4);
          }
          local_9c = *(float *)((long)&((local_78.input_mask)->
                                       super_TemplatedValidityMask<unsigned_long>).validity_mask +
                               uVar9 * 4);
          iVar3._M_current = *(float **)(state + 8);
          if (iVar3._M_current == *(float **)(state + 0x10)) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      ((vector<float,_std::allocator<float>_> *)state,iVar3,&local_9c);
          }
          else {
            *iVar3._M_current = local_9c;
            *(float **)(state + 8) = iVar3._M_current + 1;
          }
          uVar5 = uVar5 + 1;
        } while (count != uVar5);
      }
    }
    else if (count != 0) {
      pFVar2 = ((local_78.input)->bind_data).ptr;
      uVar5 = 0;
      do {
        uVar9 = uVar5;
        if (pFVar2 != (FunctionData *)0x0) {
          uVar9 = (ulong)*(uint *)(pFVar2 + uVar5 * 4);
        }
        if ((local_78.input_idx == 0) ||
           ((*(ulong *)(local_78.input_idx + (uVar9 >> 6) * 8) >> (uVar9 & 0x3f) & 1) != 0)) {
          local_9c = *(float *)((long)&((local_78.input_mask)->
                                       super_TemplatedValidityMask<unsigned_long>).validity_mask +
                               uVar9 * 4);
          iVar3._M_current = *(float **)(state + 8);
          if (iVar3._M_current == *(float **)(state + 0x10)) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      ((vector<float,_std::allocator<float>_> *)state,iVar3,&local_9c);
          }
          else {
            *iVar3._M_current = local_9c;
            *(float **)(state + 8) = iVar3._M_current + 1;
          }
        }
        uVar5 = uVar5 + 1;
      } while (count != uVar5);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}